

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

ShellCommandHandler * __thiscall
llbuild::buildsystem::BuildSystem::resolveShellCommandHandler
          (BuildSystem *this,ShellCommand *command)

{
  StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
  *this_00;
  void *pvVar1;
  StringRef *pSVar2;
  char *pcVar3;
  size_t sVar4;
  ShellCommandHandler *pSVar5;
  StringRef path;
  StringRef Key;
  StringRef Key_00;
  _Head_base<0UL,_llbuild::buildsystem::ShellCommandHandler_*,_false> _Var6;
  _Head_base<0UL,_llbuild::buildsystem::ShellCommandHandler_*,_false> _Var7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar9;
  BuildSystemExtension *pBVar10;
  unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>
  *puVar11;
  _Head_base<0UL,_llbuild::buildsystem::ShellCommandHandler_*,_false> local_30;
  
  pvVar1 = this->impl;
  iVar8 = (*(command->super_ExternalCommand).super_Command.super_JobDescriptor._vptr_JobDescriptor
            [0x1c])(command);
  if (*(long *)CONCAT44(extraout_var,iVar8) != ((long *)CONCAT44(extraout_var,iVar8))[1]) {
    iVar8 = (*(command->super_ExternalCommand).super_Command.super_JobDescriptor._vptr_JobDescriptor
              [0x1c])(command);
    pSVar2 = *(StringRef **)CONCAT44(extraout_var_00,iVar8);
    pcVar3 = pSVar2->Data;
    sVar4 = pSVar2->Length;
    Key_00 = *pSVar2;
    Key = *pSVar2;
    path = *pSVar2;
    this_00 = (StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
               *)((long)pvVar1 + 0x118);
    iVar9 = llvm::
            StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
            ::find(this_00,*pSVar2);
    if (iVar9.
        super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>_>
        .Ptr != (StringMapEntryBase **)
                ((ulong)*(uint *)((long)pvVar1 + 0x120) * 8 + *(long *)((long)pvVar1 + 0x118))) {
      return *(ShellCommandHandler **)
              (*(long *)iVar9.
                        super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>_>
                        .Ptr + 8);
    }
    pBVar10 = BuildSystemExtensionManager::lookupByCommandPath(&extensionManager,path);
    if (pBVar10 != (BuildSystemExtension *)0x0) {
      (*pBVar10->_vptr_BuildSystemExtension[2])(&local_30,pBVar10,pcVar3,sVar4);
      _Var6._M_head_impl = local_30._M_head_impl;
      puVar11 = llvm::
                StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
                ::operator[](this_00,Key);
      _Var7._M_head_impl = local_30._M_head_impl;
      local_30._M_head_impl = (ShellCommandHandler *)0x0;
      pSVar5 = (puVar11->_M_t).
               super___uniq_ptr_impl<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::buildsystem::ShellCommandHandler_*,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>
               .super__Head_base<0UL,_llbuild::buildsystem::ShellCommandHandler_*,_false>.
               _M_head_impl;
      (puVar11->_M_t).
      super___uniq_ptr_impl<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>
      ._M_t.
      super__Tuple_impl<0UL,_llbuild::buildsystem::ShellCommandHandler_*,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>
      .super__Head_base<0UL,_llbuild::buildsystem::ShellCommandHandler_*,_false>._M_head_impl =
           _Var7._M_head_impl;
      if (pSVar5 != (ShellCommandHandler *)0x0) {
        (*pSVar5->_vptr_ShellCommandHandler[1])();
      }
      if (local_30._M_head_impl == (ShellCommandHandler *)0x0) {
        return _Var6._M_head_impl;
      }
      (*(local_30._M_head_impl)->_vptr_ShellCommandHandler[1])();
      return _Var6._M_head_impl;
    }
    puVar11 = llvm::
              StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
              ::operator[](this_00,Key_00);
    pSVar5 = (puVar11->_M_t).
             super___uniq_ptr_impl<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::buildsystem::ShellCommandHandler_*,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>
             .super__Head_base<0UL,_llbuild::buildsystem::ShellCommandHandler_*,_false>._M_head_impl
    ;
    (puVar11->_M_t).
    super___uniq_ptr_impl<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>
    ._M_t.
    super__Tuple_impl<0UL,_llbuild::buildsystem::ShellCommandHandler_*,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>
    .super__Head_base<0UL,_llbuild::buildsystem::ShellCommandHandler_*,_false>._M_head_impl =
         (ShellCommandHandler *)0x0;
    if (pSVar5 != (ShellCommandHandler *)0x0) {
      (*pSVar5->_vptr_ShellCommandHandler[1])();
    }
  }
  return (ShellCommandHandler *)0x0;
}

Assistant:

ShellCommandHandler*
BuildSystem::resolveShellCommandHandler(ShellCommand* command) {
  return static_cast<BuildSystemImpl*>(impl)->resolveShellCommandHandler(command);
}